

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-trainer-CH.cc
# Opt level: O0

void ReadSentencePair(string *line,vector<int,_std::allocator<int>_> *s,Dict *sd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *c,Dict *cd,
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *l,Dict *ld,int *unk,int *total)

{
  bool bVar1;
  byte bVar2;
  __type _Var3;
  ulong uVar4;
  size_type sVar5;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RCX;
  vector<int,_std::allocator<int>_> *in_RSI;
  undefined8 in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int k;
  int f;
  string sep;
  string word;
  istringstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd90;
  reference in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  int iVar6;
  undefined4 in_stack_fffffffffffffdfc;
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [32];
  long local_1b0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_20;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,in_RDI,8);
  std::__cxx11::string::string(local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"|||",&local_1f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  iVar6 = 0;
  while (bVar1 = std::ios::operator_cast_to_bool
                           ((ios *)((long)local_1b0 + *(long *)(local_1b0[0] + -0x18))), bVar1) {
    std::operator>>((istream *)local_1b0,local_1d0);
    bVar2 = std::ios::operator!((ios *)((long)local_1b0 + *(long *)(local_1b0[0] + -0x18)));
    if ((bVar2 & 1) != 0) break;
    _Var3 = std::operator==(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    if (_Var3) {
      iVar6 = iVar6 + 1;
    }
    else if (iVar6 == 0) {
      *in_stack_00000018 = *in_stack_00000018 + 1;
      normalize_digital_lower
                ((string *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      in_stack_fffffffffffffdf4 =
           cnn::Dict::Convert((Dict *)CONCAT44(in_stack_fffffffffffffdfc,iVar6),
                              (string *)
                              CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      if (in_stack_fffffffffffffdf4 == kUNK) {
        *in_stack_00000010 = *in_stack_00000010 + 1;
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (value_type_conflict *)in_stack_fffffffffffffd98);
    }
    else {
      uVar4 = (ulong)iVar6;
      sVar5 = std::vector<int,_std::allocator<int>_>::size(local_10);
      if (sVar5 < uVar4) {
        in_stack_fffffffffffffdb0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)iVar6;
        sVar5 = std::vector<int,_std::allocator<int>_>::size(local_10);
        if (in_stack_fffffffffffffdb0 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar5 + 1)) {
          in_stack_fffffffffffffda8 = local_30;
          std::vector<int,_std::allocator<int>_>::size(local_10);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
        }
        in_stack_fffffffffffffd90 = (vector<int,_std::allocator<int>_> *)(long)iVar6;
        in_stack_fffffffffffffd88 = local_30;
        sVar5 = std::vector<int,_std::allocator<int>_>::size(local_10);
        in_stack_fffffffffffffd98 =
             std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)in_stack_fffffffffffffd88,
                          (long)&(in_stack_fffffffffffffd90->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + ~sVar5);
        in_stack_fffffffffffffda4 =
             cnn::Dict::Convert((Dict *)CONCAT44(in_stack_fffffffffffffdfc,iVar6),
                                (string *)
                                CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_fffffffffffffd90,(value_type_conflict *)in_stack_fffffffffffffd88);
      }
      else {
        if (iVar6 == 1) {
          std::vector<int,_std::allocator<int>_>::size(local_10);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](local_20,(long)(iVar6 + -1));
        in_stack_fffffffffffffdf0 =
             cnn::Dict::Convert((Dict *)CONCAT44(in_stack_fffffffffffffdfc,iVar6),
                                (string *)
                                CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_fffffffffffffd90,(value_type_conflict *)in_stack_fffffffffffffd88);
      }
    }
  }
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  return;
}

Assistant:

void ReadSentencePair(const string& line, vector<int>* s, cnn::Dict* sd, vector< vector<int> >& c, cnn::Dict* cd, vector< vector<int> >& l, cnn::Dict* ld, int& unk, int& total){
  istringstream in(line);
  string word;
  string sep = "|||";
  int f = 0;

  while(in) {
    in >> word;
    if (!in) break;

    if (word == sep) { f+=1; continue; }
    
    if(f == 0) {
      total += 1;
      normalize_digital_lower(word);
      int k = sd->Convert(word);
      if(k == kUNK) unk++;
      s->push_back(k);
    }
    else if( f <= s->size()){
       if(f == 1) c.resize(s->size());
       c[f-1].push_back(cd->Convert(word));
    }
    else {
      if(f == s->size()+1) l.resize(s->size());
      l[f-(s->size())-1].push_back(ld->Convert(word));
    }
  }
}